

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O2

bool __thiscall Opcode::AABBNoLeafTree::Build(AABBNoLeafTree *this,AABBTree *tree)

{
  undefined8 *puVar1;
  bool bVar2;
  ulong *puVar3;
  long lVar4;
  AABBNoLeafNode *pAVar5;
  long lVar6;
  udword uVar7;
  udword CurID;
  udword local_2c;
  
  if (tree != (AABBTree *)0x0) {
    uVar7 = (tree->super_AABBTreeNode).mNbPrimitives;
    if (tree->mTotalNbNodes == uVar7 * 2 - 1) {
      uVar7 = uVar7 - 1;
      if ((this->super_AABBOptimizedTree).mNbNodes == uVar7) {
        pAVar5 = this->mNodes;
      }
      else {
        (this->super_AABBOptimizedTree).mNbNodes = uVar7;
        pAVar5 = this->mNodes;
        if (pAVar5 != (AABBNoLeafNode *)0x0) {
          operator_delete__(&pAVar5[-1].mNegData,pAVar5[-1].mNegData * 0x28 + 8);
          this->mNodes = (AABBNoLeafNode *)0x0;
          uVar7 = (this->super_AABBOptimizedTree).mNbNodes;
        }
        lVar6 = (ulong)uVar7 * 0x28;
        puVar3 = (ulong *)operator_new__(lVar6 + 8);
        *puVar3 = (ulong)uVar7;
        pAVar5 = (AABBNoLeafNode *)(puVar3 + 1);
        if (uVar7 != 0) {
          lVar4 = 0;
          do {
            puVar1 = (undefined8 *)((long)puVar3 + lVar4 + 0x20);
            *puVar1 = 0;
            puVar1[1] = 0;
            lVar4 = lVar4 + 0x28;
          } while (lVar6 - lVar4 != 0);
        }
        this->mNodes = pAVar5;
      }
      local_2c = 1;
      _BuildNoLeafTree(pAVar5,0,&local_2c,&tree->super_AABBTreeNode);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool AABBNoLeafTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	if(mNbNodes!=NbTriangles-1)	// Same number of nodes => keep moving
	{
		mNbNodes = NbTriangles-1;
		DELETEARRAY(mNodes);
		mNodes = new AABBNoLeafNode[mNbNodes];
		CHECKALLOC(mNodes);
	}

	// Build the tree
	udword CurID = 1;
	_BuildNoLeafTree(mNodes, 0, CurID, tree);
	ASSERT(CurID==mNbNodes);

	return true;
}